

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

QModelIndex * __thiscall
QColumnView::moveCursor(QColumnView *this,CursorAction cursorAction,KeyboardModifiers modifiers)

{
  bool bVar1;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  int in_EDX;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex current;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  QModelIndex *this_00;
  int local_7c;
  QModelIndex local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = QAbstractItemView::model((QAbstractItemView *)in_RDI);
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    QModelIndex::QModelIndex((QModelIndex *)0x863e42);
  }
  else {
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    local_20.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::currentIndex((QAbstractItemView *)this_00);
    bVar1 = QWidget::isRightToLeft((QWidget *)0x863e90);
    local_7c = in_EDX;
    if (bVar1) {
      if (in_EDX == 2) {
        local_7c = 3;
      }
      else if (in_EDX == 3) {
        local_7c = 2;
      }
    }
    if (local_7c == 2) {
      QModelIndex::parent(this_00);
      bVar1 = QModelIndex::isValid((QModelIndex *)CONCAT44(local_7c,in_stack_ffffffffffffff60));
      in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 & 0xffffff;
      if (bVar1) {
        QModelIndex::parent(this_00);
        QAbstractItemView::rootIndex
                  ((QAbstractItemView *)CONCAT44(local_7c,in_stack_ffffffffffffff60));
        bVar1 = ::operator!=((QModelIndex *)CONCAT44(local_7c,in_stack_ffffffffffffff60),
                             (QModelIndex *)
                             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff60 = (uint)bVar1 << 0x18;
      }
      if ((char)(in_stack_ffffffffffffff60 >> 0x18) == '\0') {
        in_RDI->r = local_20.r;
        in_RDI->c = local_20.c;
        in_RDI->i = local_20.i;
        (in_RDI->m).ptr = local_20.m.ptr;
      }
      else {
        QModelIndex::parent(this_00);
      }
    }
    else if (local_7c == 3) {
      pQVar2 = QAbstractItemView::model((QAbstractItemView *)this_00);
      uVar3 = (**(code **)(*(long *)pQVar2 + 0x88))(pQVar2,&local_20);
      if ((uVar3 & 1) == 0) {
        QModelIndex::row(&local_20);
        QModelIndex::column(&local_20);
        QModelIndex::sibling(this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      }
      else {
        pQVar2 = QAbstractItemView::model((QAbstractItemView *)this_00);
        (**(code **)(*(long *)pQVar2 + 0x60))(in_RDI,pQVar2,0,0,&local_20);
      }
    }
    else {
      QModelIndex::QModelIndex((QModelIndex *)0x864019);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QModelIndex QColumnView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    // the child views which have focus get to deal with this first and if
    // they don't accept it then it comes up this view and we only grip left/right
    Q_UNUSED(modifiers);
    if (!model())
        return QModelIndex();

    QModelIndex current = currentIndex();
    if (isRightToLeft()) {
        if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
        else if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
    }
    switch (cursorAction) {
    case MoveLeft:
        if (current.parent().isValid() && current.parent() != rootIndex())
            return (current.parent());
        else
            return current;

    case MoveRight:
        if (model()->hasChildren(current))
            return model()->index(0, 0, current);
        else
            return current.sibling(current.row() + 1, current.column());

    default:
        break;
    }

    return QModelIndex();
}